

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::CheckTypeAndMergeFrom
          (BiDirectionalLSTMLayerParams *this,MessageLite *from)

{
  ulong uVar1;
  uint64_t uVar2;
  LogMessage *other;
  LSTMParams *this_00;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__BiDirectionalLSTMLayerParams_00489b48) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::BiDirectionalLSTMLayerParams *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((BiDirectionalLSTMLayerParams *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x90c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,
             (RepeatedPtrFieldBase *)(from + 1));
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,
             (RepeatedPtrFieldBase *)&from[2]._internal_metadata_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
            (&(this->weightparams_).super_RepeatedPtrFieldBase,(RepeatedPtrFieldBase *)(from + 4));
  from_00 = (undefined1 *)from[5]._internal_metadata_.ptr_;
  if ((LSTMParams *)from_00 != (LSTMParams *)0x0 &&
      from != (MessageLite *)_BiDirectionalLSTMLayerParams_default_instance_) {
    this_00 = this->params_;
    if (this_00 == (LSTMParams *)0x0) {
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LSTMParams>
                          (arena);
      this->params_ = this_00;
      from_00 = (undefined1 *)from[5]._internal_metadata_.ptr_;
    }
    if ((LSTMParams *)from_00 == (LSTMParams *)0x0) {
      from_00 = _LSTMParams_default_instance_;
    }
    LSTMParams::MergeFrom(this_00,(LSTMParams *)from_00);
  }
  if (from[6]._vptr_MessageLite != (_func_int **)0x0) {
    this->inputvectorsize_ = (uint64_t)from[6]._vptr_MessageLite;
  }
  uVar2 = from[6]._internal_metadata_.ptr_;
  if (uVar2 != 0) {
    this->outputvectorsize_ = uVar2;
  }
  uVar1 = (from->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}